

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int ptls_handshake(ptls_t *tls,ptls_buffer_t *_sendbuf,void *input,size_t *inlen,
                  ptls_handshake_properties_t *properties)

{
  en_ptls_state_t eVar1;
  size_t sVar2;
  uint8_t description;
  int iVar3;
  uint uVar4;
  void *pvVar5;
  size_t consumed;
  st_ptls_record_message_emitter_t emitter;
  ptls_buffer_t local_50;
  
  eVar1 = tls->state;
  if (PTLS_STATE_SERVER_EXPECT_FINISHED < eVar1) {
    __assert_fail("tls->state < PTLS_STATE_POST_HANDSHAKE_MIN",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                  ,0x1787,
                  "int ptls_handshake(ptls_t *, ptls_buffer_t *, const void *, size_t *, ptls_handshake_properties_t *)"
                 );
  }
  emitter.super.enc = &(tls->traffic_protection).enc;
  emitter.super.record_header_length = 5;
  emitter.super.begin_message = begin_record_message;
  emitter.super.commit_message = commit_record_message;
  emitter.rec_start = 0;
  emitter.super.buf = _sendbuf;
  if (eVar1 == PTLS_STATE_SERVER_GENERATING_CERTIFICATE_VERIFY) {
    iVar3 = server_finish_handshake(tls,&emitter.super,1,(st_ptls_signature_algorithms_t *)0x0);
    return iVar3;
  }
  if (eVar1 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
    if ((input != (void *)0x0) && (*inlen != 0)) {
      __assert_fail("input == NULL || *inlen == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                    ,0x178f,
                    "int ptls_handshake(ptls_t *, ptls_buffer_t *, const void *, size_t *, ptls_handshake_properties_t *)"
                   );
    }
    iVar3 = send_client_hello(tls,&emitter.super,properties,(ptls_iovec_t *)0x0);
    return iVar3;
  }
  sVar2 = _sendbuf->off;
  pvVar5 = (void *)(*inlen + (long)input);
  local_50.base = "";
  local_50.is_allocated = '\0';
  local_50.align_bits = '\0';
  local_50.capacity = 0;
  local_50.off = 0;
  uVar4 = 0x202;
  for (; (uVar4 == 0x202 && (input != pvVar5)); input = (void *)((long)input + consumed)) {
    consumed = (long)pvVar5 - (long)input;
    uVar4 = handle_input(tls,&emitter.super,&local_50,input,&consumed,properties);
    if (local_50.off != 0) {
      __assert_fail("decryptbuf.off == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                    ,0x17a3,
                    "int ptls_handshake(ptls_t *, ptls_buffer_t *, const void *, size_t *, ptls_handshake_properties_t *)"
                   );
    }
  }
  ptls_buffer_dispose(&local_50);
  if (((9 < uVar4 - 0x202) || ((0x211U >> (uVar4 - 0x202 & 0x1f) & 1) == 0)) && (uVar4 != 0)) {
    if (uVar4 == 0x79) {
      description = 'y';
    }
    else {
      (*ptls_clear_memory)((emitter.super.buf)->base + sVar2,(emitter.super.buf)->off - sVar2);
      (emitter.super.buf)->off = sVar2;
      if ((uVar4 & 0xffffff00) == 0x100) goto LAB_00116e27;
      description = 'P';
      if ((uVar4 & 0xffffff00) == 0) {
        description = (uint8_t)uVar4;
      }
    }
    iVar3 = ptls_send_alert(tls,emitter.super.buf,'\x02',description);
    if (iVar3 != 0) {
      (emitter.super.buf)->off = sVar2;
    }
  }
LAB_00116e27:
  *inlen = (long)input + (*inlen - (long)pvVar5);
  return uVar4;
}

Assistant:

int ptls_handshake(ptls_t *tls, ptls_buffer_t *_sendbuf, const void *input, size_t *inlen, ptls_handshake_properties_t *properties)
{
    struct st_ptls_record_message_emitter_t emitter;
    int ret;

    assert(tls->state < PTLS_STATE_POST_HANDSHAKE_MIN);

    init_record_message_emitter(tls, &emitter, _sendbuf);
    size_t sendbuf_orig_off = emitter.super.buf->off;

    /* special handlings */
    switch (tls->state) {
    case PTLS_STATE_CLIENT_HANDSHAKE_START: {
        assert(input == NULL || *inlen == 0);
        return send_client_hello(tls, &emitter.super, properties, NULL);
    }
    case PTLS_STATE_SERVER_GENERATING_CERTIFICATE_VERIFY:
        return server_finish_handshake(tls, &emitter.super, 1, NULL);
    default:
        break;
    }

    const uint8_t *src = input, *const src_end = src + *inlen;
    ptls_buffer_t decryptbuf;

    ptls_buffer_init(&decryptbuf, "", 0);

    /* perform handhake until completion or until all the input has been swallowed */
    ret = PTLS_ERROR_IN_PROGRESS;
    while (ret == PTLS_ERROR_IN_PROGRESS && src != src_end) {
        size_t consumed = src_end - src;
        ret = handle_input(tls, &emitter.super, &decryptbuf, src, &consumed, properties);
        src += consumed;
        assert(decryptbuf.off == 0);
    }

    ptls_buffer_dispose(&decryptbuf);

    switch (ret) {
    case 0:
    case PTLS_ERROR_IN_PROGRESS:
    case PTLS_ERROR_STATELESS_RETRY:
    case PTLS_ERROR_ASYNC_OPERATION:
        break;
    default:
        /* Flush handshake messages that have been written partially. ECH_REQUIRED sticks out because it is a message sent
         * post-handshake compared to other alerts that are generating *during* the handshake. */
        if (ret != PTLS_ALERT_ECH_REQUIRED) {
            ptls_clear_memory(emitter.super.buf->base + sendbuf_orig_off, emitter.super.buf->off - sendbuf_orig_off);
            emitter.super.buf->off = sendbuf_orig_off;
        }
        /* send alert immediately */
        if (PTLS_ERROR_GET_CLASS(ret) != PTLS_ERROR_CLASS_PEER_ALERT)
            if (ptls_send_alert(tls, emitter.super.buf, PTLS_ALERT_LEVEL_FATAL,
                                PTLS_ERROR_GET_CLASS(ret) == PTLS_ERROR_CLASS_SELF_ALERT ? ret : PTLS_ALERT_INTERNAL_ERROR) != 0)
                emitter.super.buf->off = sendbuf_orig_off;
        break;
    }

    *inlen -= src_end - src;
    return ret;
}